

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
 __thiscall
absl::lts_20250127::container_internal::
btree<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
::
internal_last<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>,int_const&,int_const*>>
          (btree<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
           *this,btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                 iter)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  bVar4;
  
  if (this == (btree<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
               *)0x0) {
    __assert_fail("iter.node_ != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                  ,0xaec,
                  "static IterType absl::container_internal::btree<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::internal_last(IterType) [Params = absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>, IterType = absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>>, const int &, const int *>]"
                 );
  }
  uVar3 = (ulong)iter.node_ & 0xffffffff;
  do {
    bVar1 = btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            ::finish((btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                      *)this);
    if ((uint)uVar3 != (uint)bVar1) goto LAB_0019b03c;
    bVar1 = btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            ::position((btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                        *)this);
    uVar3 = (ulong)bVar1;
    this = (btree<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
            *)btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
              ::parent((btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                        *)this);
    bVar2 = btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            ::is_leaf((btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                       *)this);
  } while (!bVar2);
  this = (btree<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
          *)0x0;
LAB_0019b03c:
  bVar4._8_8_ = uVar3;
  bVar4.node_ = (btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                 *)this;
  return bVar4;
}

Assistant:

inline IterType btree<P>::internal_last(IterType iter) {
  assert(iter.node_ != nullptr);
  while (iter.position_ == iter.node_->finish()) {
    iter.position_ = iter.node_->position();
    iter.node_ = iter.node_->parent();
    if (iter.node_->is_leaf()) {
      iter.node_ = nullptr;
      break;
    }
  }
  iter.update_generation();
  return iter;
}